

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImDrawList::ChannelsMerge(ImDrawList *this)

{
  ImVector<unsigned_short> *pIVar1;
  int iVar2;
  ImDrawChannel *pIVar3;
  unsigned_short *puVar4;
  ImDrawCmd *__dest;
  unsigned_short *__dest_00;
  long lVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  ImDrawCmd *pIVar11;
  int iVar12;
  
  if (1 < this->_ChannelsCount) {
    if ((long)this->_ChannelsCurrent != 0) {
      iVar2 = (this->CmdBuffer).Capacity;
      pIVar11 = (this->CmdBuffer).Data;
      pIVar3 = (this->_Channels).Data + this->_ChannelsCurrent;
      (pIVar3->CmdBuffer).Size = (this->CmdBuffer).Size;
      (pIVar3->CmdBuffer).Capacity = iVar2;
      (pIVar3->CmdBuffer).Data = pIVar11;
      iVar2 = (this->IdxBuffer).Capacity;
      puVar4 = (this->IdxBuffer).Data;
      pIVar1 = &(this->_Channels).Data[this->_ChannelsCurrent].IdxBuffer;
      pIVar1->Size = (this->IdxBuffer).Size;
      pIVar1->Capacity = iVar2;
      pIVar1->Data = puVar4;
      this->_ChannelsCurrent = 0;
      pIVar3 = (this->_Channels).Data;
      iVar2 = (pIVar3->CmdBuffer).Capacity;
      pIVar11 = (pIVar3->CmdBuffer).Data;
      (this->CmdBuffer).Size = (pIVar3->CmdBuffer).Size;
      (this->CmdBuffer).Capacity = iVar2;
      (this->CmdBuffer).Data = pIVar11;
      iVar2 = (pIVar3->IdxBuffer).Capacity;
      puVar4 = (pIVar3->IdxBuffer).Data;
      (this->IdxBuffer).Size = (pIVar3->IdxBuffer).Size;
      (this->IdxBuffer).Capacity = iVar2;
      (this->IdxBuffer).Data = puVar4;
      this->_IdxWritePtr = (this->IdxBuffer).Data + (this->IdxBuffer).Size;
    }
    iVar2 = (this->CmdBuffer).Size;
    if (((long)iVar2 != 0) && ((this->CmdBuffer).Data[(long)iVar2 + -1].ElemCount == 0)) {
      (this->CmdBuffer).Size = iVar2 + -1;
    }
    iVar2 = this->_ChannelsCount;
    iVar12 = 0;
    iVar7 = 0;
    if (1 < (long)iVar2) {
      pIVar3 = (this->_Channels).Data;
      iVar7 = 0;
      lVar6 = 0x20;
      iVar12 = 0;
      do {
        iVar8 = *(int *)((long)&(pIVar3->CmdBuffer).Size + lVar6);
        if (((long)iVar8 != 0) &&
           (*(int *)(*(long *)((long)&(pIVar3->CmdBuffer).Data + lVar6) + -0x30 + (long)iVar8 * 0x30
                    ) == 0)) {
          *(int *)((long)&(pIVar3->CmdBuffer).Size + lVar6) = iVar8 + -1;
        }
        iVar7 = iVar7 + *(int *)((long)&(pIVar3->CmdBuffer).Size + lVar6);
        iVar12 = iVar12 + *(int *)((long)&(pIVar3->IdxBuffer).Size + lVar6);
        lVar6 = lVar6 + 0x20;
      } while ((long)iVar2 * 0x20 != lVar6);
    }
    iVar8 = (this->CmdBuffer).Size + iVar7;
    iVar2 = (this->CmdBuffer).Capacity;
    if (iVar2 < iVar8) {
      if (iVar2 == 0) {
        iVar9 = 8;
      }
      else {
        iVar9 = iVar2 / 2 + iVar2;
      }
      if (iVar9 <= iVar8) {
        iVar9 = iVar8;
      }
      if (iVar2 < iVar9) {
        __dest = (ImDrawCmd *)ImGui::MemAlloc((long)iVar9 * 0x30);
        pIVar11 = (this->CmdBuffer).Data;
        if (pIVar11 != (ImDrawCmd *)0x0) {
          memcpy(__dest,pIVar11,(long)(this->CmdBuffer).Size * 0x30);
          ImGui::MemFree((this->CmdBuffer).Data);
        }
        (this->CmdBuffer).Data = __dest;
        (this->CmdBuffer).Capacity = iVar9;
      }
    }
    (this->CmdBuffer).Size = iVar8;
    lVar6 = (long)(this->IdxBuffer).Size + (long)iVar12;
    iVar2 = (this->IdxBuffer).Capacity;
    iVar8 = (int)lVar6;
    if (iVar2 < iVar8) {
      if (iVar2 == 0) {
        iVar9 = 8;
      }
      else {
        iVar9 = iVar2 / 2 + iVar2;
      }
      if (iVar9 <= iVar8) {
        iVar9 = iVar8;
      }
      if (iVar2 < iVar9) {
        __dest_00 = (unsigned_short *)ImGui::MemAlloc((long)iVar9 * 2);
        puVar4 = (this->IdxBuffer).Data;
        if (puVar4 != (unsigned_short *)0x0) {
          memcpy(__dest_00,puVar4,(long)(this->IdxBuffer).Size * 2);
          ImGui::MemFree((this->IdxBuffer).Data);
        }
        (this->IdxBuffer).Data = __dest_00;
        (this->IdxBuffer).Capacity = iVar9;
      }
    }
    (this->IdxBuffer).Size = iVar8;
    pIVar11 = (this->CmdBuffer).Data;
    iVar2 = (this->CmdBuffer).Size;
    this->_IdxWritePtr = (this->IdxBuffer).Data + (lVar6 - iVar12);
    if (1 < this->_ChannelsCount) {
      pIVar11 = pIVar11 + ((long)iVar2 - (long)iVar7);
      lVar6 = 1;
      lVar10 = 0x38;
      do {
        pIVar3 = (this->_Channels).Data;
        lVar5 = (long)*(int *)((long)pIVar3 + lVar10 + -0x18);
        if (lVar5 != 0) {
          memcpy(pIVar11,*(void **)((long)pIVar3 + lVar10 + -0x10),lVar5 * 0x30);
          pIVar11 = pIVar11 + lVar5;
        }
        lVar5 = (long)*(int *)((long)pIVar3 + lVar10 + -8);
        if (lVar5 != 0) {
          memcpy(this->_IdxWritePtr,*(void **)((long)&(pIVar3->CmdBuffer).Size + lVar10),lVar5 * 2);
          this->_IdxWritePtr = this->_IdxWritePtr + lVar5;
        }
        lVar6 = lVar6 + 1;
        lVar10 = lVar10 + 0x20;
      } while (lVar6 < this->_ChannelsCount);
    }
    UpdateClipRect(this);
    this->_ChannelsCount = 1;
  }
  return;
}

Assistant:

void ImDrawList::ChannelsMerge()
{
    // Note that we never use or rely on channels.Size because it is merely a buffer that we never shrink back to 0 to keep all sub-buffers ready for use.
    if (_ChannelsCount <= 1)
        return;

    ChannelsSetCurrent(0);
    if (CmdBuffer.Size && CmdBuffer.back().ElemCount == 0)
        CmdBuffer.pop_back();

    int new_cmd_buffer_count = 0, new_idx_buffer_count = 0;
    for (int i = 1; i < _ChannelsCount; i++)
    {
        ImDrawChannel& ch = _Channels[i];
        if (ch.CmdBuffer.Size && ch.CmdBuffer.back().ElemCount == 0)
            ch.CmdBuffer.pop_back();
        new_cmd_buffer_count += ch.CmdBuffer.Size;
        new_idx_buffer_count += ch.IdxBuffer.Size;
    }
    CmdBuffer.resize(CmdBuffer.Size + new_cmd_buffer_count);
    IdxBuffer.resize(IdxBuffer.Size + new_idx_buffer_count);

    ImDrawCmd* cmd_write = CmdBuffer.Data + CmdBuffer.Size - new_cmd_buffer_count;
    _IdxWritePtr = IdxBuffer.Data + IdxBuffer.Size - new_idx_buffer_count;
    for (int i = 1; i < _ChannelsCount; i++)
    {
        ImDrawChannel& ch = _Channels[i];
        if (int sz = ch.CmdBuffer.Size) { memcpy(cmd_write, ch.CmdBuffer.Data, sz * sizeof(ImDrawCmd)); cmd_write += sz; }
        if (int sz = ch.IdxBuffer.Size) { memcpy(_IdxWritePtr, ch.IdxBuffer.Data, sz * sizeof(ImDrawIdx)); _IdxWritePtr += sz; }
    }
    UpdateClipRect(); // We call this instead of AddDrawCmd(), so that empty channels won't produce an extra draw call.
    _ChannelsCount = 1;
}